

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_sofa_c.c
# Opt level: O0

void t_apci13(int *status)

{
  iauASTROM astrom;
  double eo;
  double date2;
  double date1;
  int *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  double in_stack_ffffffffffffff10;
  double in_stack_ffffffffffffff18;
  double in_stack_ffffffffffffff20;
  double *in_stack_ffffffffffffffb8;
  iauASTROM *in_stack_ffffffffffffffc0;
  double in_stack_ffffffffffffffc8;
  double in_stack_ffffffffffffffd0;
  
  iauApci13(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
            in_stack_ffffffffffffffb8);
  vvd(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
      in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  vvd(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
      in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  vvd(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
      in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  vvd(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
      in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  vvd(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
      in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  vvd(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
      in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  vvd(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
      in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  vvd(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
      in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  vvd(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
      in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  vvd(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
      in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  vvd(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
      in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  vvd(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
      in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  vvd(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
      in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  vvd(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
      in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  vvd(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
      in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  vvd(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
      in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  vvd(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
      in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  vvd(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
      in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  vvd(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
      in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  vvd(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
      in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  vvd(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
      in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  vvd(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
      in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  return;
}

Assistant:

static void t_apci13(int *status)
/*
**  - - - - - - - - -
**   t _ a p c i 1 3
**  - - - - - - - - -
**
**  Test iauApci13 function.
**
**  Returned:
**     status    int         FALSE = success, TRUE = fail
**
**  Called:  iauApci13, vvd
**
**  This revision:  2017 March 15
*/
{
   double date1, date2, eo;
   iauASTROM astrom;


   date1 = 2456165.5;
   date2 = 0.401182685;

   iauApci13(date1, date2, &astrom, &eo);

   vvd(astrom.pmt, 12.65133794027378508, 1e-11,
                   "iauApci13", "pmt", status);
   vvd(astrom.eb[0], 0.9013108747340644755, 1e-12,
                     "iauApci13", "eb(1)", status);
   vvd(astrom.eb[1], -0.4174026640406119957, 1e-12,
                     "iauApci13", "eb(2)", status);
   vvd(astrom.eb[2], -0.1809822877867817771, 1e-12,
                     "iauApci13", "eb(3)", status);
   vvd(astrom.eh[0], 0.8940025429255499549, 1e-12,
                     "iauApci13", "eh(1)", status);
   vvd(astrom.eh[1], -0.4110930268331896318, 1e-12,
                     "iauApci13", "eh(2)", status);
   vvd(astrom.eh[2], -0.1782189006019749850, 1e-12,
                     "iauApci13", "eh(3)", status);
   vvd(astrom.em, 1.010465295964664178, 1e-12,
                  "iauApci13", "em", status);
   vvd(astrom.v[0], 0.4289638912941341125e-4, 1e-16,
                    "iauApci13", "v(1)", status);
   vvd(astrom.v[1], 0.8115034032405042132e-4, 1e-16,
                    "iauApci13", "v(2)", status);
   vvd(astrom.v[2], 0.3517555135536470279e-4, 1e-16,
                    "iauApci13", "v(3)", status);
   vvd(astrom.bm1, 0.9999999951686013142, 1e-12,
                   "iauApci13", "bm1", status);
   vvd(astrom.bpn[0][0], 0.9999992060376761710, 1e-12,
                         "iauApci13", "bpn(1,1)", status);
   vvd(astrom.bpn[1][0], 0.4124244860106037157e-7, 1e-12,
                         "iauApci13", "bpn(2,1)", status);
   vvd(astrom.bpn[2][0], 0.1260128571051709670e-2, 1e-12,
                         "iauApci13", "bpn(3,1)", status);
   vvd(astrom.bpn[0][1], -0.1282291987222130690e-7, 1e-12,
                         "iauApci13", "bpn(1,2)", status);
   vvd(astrom.bpn[1][1], 0.9999999997456835325, 1e-12,
                         "iauApci13", "bpn(2,2)", status);
   vvd(astrom.bpn[2][1], -0.2255288829420524935e-4, 1e-12,
                         "iauApci13", "bpn(3,2)", status);
   vvd(astrom.bpn[0][2], -0.1260128571661374559e-2, 1e-12,
                         "iauApci13", "bpn(1,3)", status);
   vvd(astrom.bpn[1][2], 0.2255285422953395494e-4, 1e-12,
                         "iauApci13", "bpn(2,3)", status);
   vvd(astrom.bpn[2][2], 0.9999992057833604343, 1e-12,
                         "iauApci13", "bpn(3,3)", status);
   vvd(eo, -0.2900618712657375647e-2, 1e-12,
           "iauApci13", "eo", status);

}